

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMLeaf.hpp
# Opt level: O0

void __thiscall xercesc_4_0::CMLeaf::calcFirstPos(CMLeaf *this,CMStateSet *toSet)

{
  bool bVar1;
  CMStateSet *toSet_local;
  CMLeaf *this_local;
  
  bVar1 = CMNode::isNullable(&this->super_CMNode);
  if (bVar1) {
    CMStateSet::zeroBits(toSet);
  }
  else {
    CMStateSet::setBit(toSet,(ulong)this->fPosition);
  }
  return;
}

Assistant:

inline void CMLeaf::calcFirstPos(CMStateSet& toSet) const
{
    // If we are an epsilon node, then the first pos is an empty set
    if (isNullable())
    {
        toSet.zeroBits();
        return;
    }

    // Otherwise, its just the one bit of our position
    toSet.setBit(fPosition);
}